

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

cmSourceFile *
anon_unknown.dwarf_1a1f903::AddCustomCommand
          (cmLocalGenerator *lg,cmCommandOrigin origin,
          unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *cc,bool replace)

{
  cmMakefile *pcVar1;
  cmGlobalGenerator *pcVar2;
  pointer pcVar3;
  cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *pcVar4;
  cmake *this;
  cmCustomCommandLine *pcVar5;
  cmCustomCommandLine *pcVar6;
  cmCustomCommandLine *pcVar7;
  cmListFileBacktrace *bt;
  cmCommandOrigin origin_00;
  bool bVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *outputs;
  cmCustomCommandLines *pcVar9;
  string *psVar10;
  cmSourceFile *this_00;
  cmCustomCommand *pcVar11;
  size_type sVar12;
  string *psVar13;
  cmCustomCommandLines *pcVar14;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string_view input;
  string simple;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  allConfigOutputs;
  string outName;
  cmCryptoHash h;
  cmSourceFile *local_140;
  string local_128;
  cmListFileBacktrace *local_108;
  cmCommandOrigin local_fc;
  string local_f8;
  _Head_base<0UL,_cmCustomCommand_*,_false> local_d8;
  undefined1 local_d0 [16];
  undefined1 local_c0 [40];
  cmState *local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  pointer local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_70;
  cmMakefile *local_68;
  cmCryptoHash local_60;
  string local_50;
  
  pcVar1 = lg->Makefile;
  local_fc = origin;
  local_108 = cmCustomCommand::GetBacktrace
                        ((cc->_M_t).
                         super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                         .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl);
  outputs = cmCustomCommand::GetOutputs_abi_cxx11_
                      ((cc->_M_t).
                       super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                       .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl);
  local_78 = cmCustomCommand::GetByproducts_abi_cxx11_
                       ((cc->_M_t).
                        super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                        .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl);
  pcVar9 = cmCustomCommand::GetCommandLines
                     ((cc->_M_t).
                      super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                      .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl);
  if (((pcVar9->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
       super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
       super__Vector_impl_data._M_start !=
       (pcVar9->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
       super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
       super__Vector_impl_data._M_finish) &&
     (pcVar11 = (cc->_M_t).
                super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
                super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
                super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,
     pcVar11->HasMainDependency_ == true)) {
    psVar10 = cmCustomCommand::GetMainDependency_abi_cxx11_(pcVar11);
    this_00 = cmMakefile::GetSource(pcVar1,psVar10,Ambiguous);
    if (this_00 == (cmSourceFile *)0x0) {
      local_140 = (cmSourceFile *)0x0;
      this_00 = cmMakefile::CreateSource(pcVar1,psVar10,false,Ambiguous);
      if (this_00 != (cmSourceFile *)0x0) goto LAB_00453b17;
    }
    else {
      pcVar11 = cmSourceFile::GetCustomCommand(this_00);
      if (pcVar11 == (cmCustomCommand *)0x0 || replace) goto LAB_00453b17;
      pcVar11 = cmSourceFile::GetCustomCommand(this_00);
      pcVar14 = cmCustomCommand::GetCommandLines(pcVar11);
      pcVar5 = (pcVar9->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
               super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl
               .super__Vector_impl_data._M_start;
      pcVar6 = (pcVar9->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
               super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl
               .super__Vector_impl_data._M_finish;
      pcVar7 = (pcVar14->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
               super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl
               .super__Vector_impl_data._M_start;
      local_140 = this_00;
      if (((long)pcVar6 - (long)pcVar5 ==
           (long)(pcVar14->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
                 super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)pcVar7) &&
         (bVar8 = std::__equal<false>::equal<cmCustomCommandLine_const*,cmCustomCommandLine_const*>
                            (pcVar5,pcVar6,pcVar7), bVar8)) {
        return this_00;
      }
    }
  }
  pcVar2 = lg->GlobalGenerator;
  psVar10 = (outputs->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_70 = outputs;
  local_68 = pcVar1;
  sVar12 = cmGeneratorExpression::Find(psVar10);
  pcVar3 = (psVar10->_M_dataplus)._M_p;
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_128,pcVar3,pcVar3 + psVar10->_M_string_length);
  if (sVar12 != 0xffffffffffffffff) {
    cmsys::SystemTools::ReplaceString(&local_128,"$<CONFIG>","(CONFIG)");
    sVar12 = cmGeneratorExpression::Find(&local_128);
    if (sVar12 != 0xffffffffffffffff) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      cmLocalGenerator::ExpandCustomCommandOutputGenex
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_d0,lg,psVar10,local_108);
      if (local_d0._8_8_ - local_d0._0_8_ == 0x20) {
        local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_128,*(long *)local_d0._0_8_,
                   (long)&((*(pointer *)(local_d0._0_8_ + 8))->CurrentScope).Tree +
                   *(long *)local_d0._0_8_);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_d0);
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_d0);
        cmCryptoHash::cmCryptoHash(&local_60,AlgoSHA256);
        cmStateSnapshot::GetDirectory
                  ((cmStateDirectory *)local_d0,&(lg->super_cmOutputConverter).StateSnapshot);
        psVar13 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)local_d0);
        local_80 = (pointer)(psVar13->_M_dataplus)._M_p;
        pcVar4 = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)
                 psVar13->_M_string_length;
        input._M_str = (psVar10->_M_dataplus)._M_p;
        input._M_len = psVar10->_M_string_length;
        cmCryptoHash::HashString_abi_cxx11_(&local_50,&local_60,input);
        std::__cxx11::string::substr((ulong)&local_f8,(ulong)&local_50);
        local_d0._8_8_ = local_80;
        local_c0._0_8_ = (cmState *)0xc;
        local_c0._8_8_ = (long)"**/CMakeFiles/" + 2;
        local_c0._16_8_ = local_f8._M_string_length;
        local_c0._24_8_ = local_f8._M_dataplus._M_p;
        views._M_len = 3;
        views._M_array = (iterator)local_d0;
        local_d0._0_8_ = pcVar4;
        cmCatViews_abi_cxx11_(&local_128,views);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        cmCryptoHash::~cmCryptoHash(&local_60);
      }
    }
  }
  (*pcVar2->_vptr_cmGlobalGenerator[0x33])(local_c0 + 0x20,pcVar2,&local_128);
  pcVar1 = local_68;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  this_00 = cmMakefile::GetSource(pcVar1,(string *)(local_c0 + 0x20),Known);
  if (this_00 == (cmSourceFile *)0x0) {
    this_00 = cmMakefile::CreateSource(pcVar1,(string *)(local_c0 + 0x20),true,Known);
LAB_00453a94:
    local_d0._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"__CMAKE_RULE","");
    cmSourceFile::SetProperty(this_00,(string *)local_d0,"1");
    if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_d0._0_8_ !=
        (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_c0) {
      operator_delete((void *)local_d0._0_8_,(ulong)(local_c0._0_8_ + 1));
    }
    bVar8 = true;
  }
  else {
    pcVar11 = cmSourceFile::GetCustomCommand(this_00);
    if (pcVar11 == (cmCustomCommand *)0x0 || replace) goto LAB_00453a94;
    pcVar11 = cmSourceFile::GetCustomCommand(this_00);
    pcVar14 = cmCustomCommand::GetCommandLines(pcVar11);
    pcVar5 = (pcVar9->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
             super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar6 = (pcVar9->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
             super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pcVar7 = (pcVar14->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
             super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (((long)pcVar6 - (long)pcVar5 !=
         (long)(pcVar14->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
               super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl
               .super__Vector_impl_data._M_finish - (long)pcVar7) ||
       (bVar8 = std::__equal<false>::equal<cmCustomCommandLine_const*,cmCustomCommandLine_const*>
                          (pcVar5,pcVar6,pcVar7), !bVar8)) {
      this = lg->GlobalGenerator->CMakeInstance;
      local_d0._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0x29;
      local_d0._8_8_ = "Attempt to add a custom rule to output\n  ";
      local_c0._0_8_ = local_98;
      local_c0._8_8_ = local_c0._32_8_;
      local_c0._16_8_ = (pointer)0x21;
      local_c0._24_8_ = "\nwhich already has a custom rule.";
      views_00._M_len = 3;
      views_00._M_array = (iterator)local_d0;
      cmCatViews_abi_cxx11_(&local_f8,views_00);
      cmake::IssueMessage(this,FATAL_ERROR,&local_f8,local_108);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
    }
    bVar8 = false;
    local_140 = this_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._32_8_ != &local_90) {
    operator_delete((void *)local_c0._32_8_,local_90._M_allocated_capacity + 1);
  }
  outputs = local_70;
  if (!bVar8) {
    return local_140;
  }
LAB_00453b17:
  cmCustomCommand::SetEscapeAllowMakeVars
            ((cc->_M_t).
             super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
             super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
             super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,true);
  origin_00 = local_fc;
  bt = local_108;
  cmLocalGenerator::AddSourceOutputs(lg,this_00,outputs,Primary,local_108,local_fc);
  cmLocalGenerator::AddSourceOutputs(lg,this_00,local_78,Byproduct,bt,origin_00);
  local_d8._M_head_impl =
       (cc->_M_t).super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t
       .super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
       super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl;
  (cc->_M_t).super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
  super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
  super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl = (cmCustomCommand *)0x0;
  cmSourceFile::SetCustomCommand
            (this_00,(unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&local_d8
            );
  std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
            ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&local_d8);
  return this_00;
}

Assistant:

cmSourceFile* AddCustomCommand(cmLocalGenerator& lg, cmCommandOrigin origin,
                               std::unique_ptr<cmCustomCommand> cc,
                               bool replace)
{
  cmMakefile* mf = lg.GetMakefile();
  const auto& lfbt = cc->GetBacktrace();
  const auto& outputs = cc->GetOutputs();
  const auto& byproducts = cc->GetByproducts();
  const auto& commandLines = cc->GetCommandLines();

  // Choose a source file on which to store the custom command.
  cmSourceFile* file = nullptr;
  if (!commandLines.empty() && cc->HasMainDependency()) {
    const auto& main_dependency = cc->GetMainDependency();
    // The main dependency was specified.  Use it unless a different
    // custom command already used it.
    file = mf->GetSource(main_dependency);
    if (file && file->GetCustomCommand() && !replace) {
      // The main dependency already has a custom command.
      if (commandLines == file->GetCustomCommand()->GetCommandLines()) {
        // The existing custom command is identical.  Silently ignore
        // the duplicate.
        return file;
      }
      // The existing custom command is different.  We need to
      // generate a rule file for this new command.
      file = nullptr;
    } else if (!file) {
      file = mf->CreateSource(main_dependency);
    }
  }

  // Generate a rule file if the main dependency is not available.
  if (!file) {
    cmGlobalGenerator* gg = lg.GetGlobalGenerator();

    // Construct a rule file associated with the first output produced.
    std::string outName = gg->GenerateRuleFile(
      ComputeCustomCommandRuleFileName(lg, lfbt, outputs[0]));

    // Check if the rule file already exists.
    file = mf->GetSource(outName, cmSourceFileLocationKind::Known);
    if (file && file->GetCustomCommand() && !replace) {
      // The rule file already exists.
      if (commandLines != file->GetCustomCommand()->GetCommandLines()) {
        lg.GetCMakeInstance()->IssueMessage(
          MessageType::FATAL_ERROR,
          cmStrCat("Attempt to add a custom rule to output\n  ", outName,
                   "\nwhich already has a custom rule."),
          lfbt);
      }
      return file;
    }

    // Create a cmSourceFile for the rule file.
    if (!file) {
      file = mf->CreateSource(outName, true, cmSourceFileLocationKind::Known);
    }
    file->SetProperty("__CMAKE_RULE", "1");
  }

  // Attach the custom command to the file.
  if (file) {
    cc->SetEscapeAllowMakeVars(true);

    lg.AddSourceOutputs(file, outputs, cmLocalGenerator::OutputRole::Primary,
                        lfbt, origin);
    lg.AddSourceOutputs(file, byproducts,
                        cmLocalGenerator::OutputRole::Byproduct, lfbt, origin);

    file->SetCustomCommand(std::move(cc));
  }
  return file;
}